

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  int i_1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  float shrink_threshold;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  size_t bucket_count;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TypeParam ht;
  float grow_threshold;
  size_type kSize;
  key_type *in_stack_fffffffffffffac8;
  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  float in_stack_fffffffffffffadc;
  float in_stack_fffffffffffffae0;
  float in_stack_fffffffffffffae4;
  float in_stack_fffffffffffffae8;
  float in_stack_fffffffffffffaec;
  float line;
  hasher *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  float in_stack_fffffffffffffafc;
  HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffb00;
  float in_stack_fffffffffffffb14;
  HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb18;
  float local_4dc;
  float local_4bc;
  float in_stack_fffffffffffffb48;
  float in_stack_fffffffffffffb4c;
  AssertHelper *in_stack_fffffffffffffb50;
  AssertionResult local_450 [2];
  size_type local_430;
  AssertionResult local_428 [3];
  value_type *in_stack_fffffffffffffc08;
  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc10;
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [36];
  int local_35c;
  float local_344;
  AssertionResult local_340 [2];
  float local_31c;
  undefined8 local_318;
  AssertionResult local_310;
  float local_2fc;
  size_type local_2e8;
  AssertionResult local_2e0 [2];
  size_type local_2c0;
  AssertionResult local_2b8 [6];
  string local_250 [36];
  int local_22c;
  string local_228 [120];
  string local_1b0 [32];
  size_type local_190;
  float local_174;
  undefined8 local_170;
  AssertionResult local_168 [2];
  float local_144;
  AssertionResult local_140;
  string local_130 [48];
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_100;
  Hasher local_f0;
  Hasher local_e4;
  undefined1 local_d8 [196];
  float local_14;
  undefined8 local_10;
  
  local_10 = 0x4098;
  for (local_14 = 0.2; local_14 <= 0.8; local_14 = local_14 + 0.2) {
    Hasher::Hasher(&local_e4,0);
    Hasher::Hasher(&local_f0,0);
    Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
    ::Alloc(&local_100,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashtable
              (in_stack_fffffffffffffb00,
               CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               in_stack_fffffffffffffaf0,
               (key_equal *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
    Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
    ::~Alloc(&local_100);
    HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_fffffffffffffb18,(int)in_stack_fffffffffffffb14);
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    std::__cxx11::string::~string(local_130);
    google::
    HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::max_load_factor((HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                       *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                      in_stack_fffffffffffffadc);
    google::
    HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::min_load_factor((HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                       *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                      in_stack_fffffffffffffadc);
    local_144 = google::
                HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                ::max_load_factor((HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffad0);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               (float *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (float *)in_stack_fffffffffffffad0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb00);
      testing::AssertionResult::failure_message((AssertionResult *)0xcba468);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb00,(Type)in_stack_fffffffffffffafc,
                 (char *)in_stack_fffffffffffffaf0,(int)in_stack_fffffffffffffaec,
                 (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb50,
                 (Message *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
      testing::Message::~Message((Message *)0xcba4cb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcba53c);
    local_170 = 0;
    local_174 = google::
                HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                ::min_load_factor((HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffad0);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               (double *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (float *)in_stack_fffffffffffffad0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb00);
      in_stack_fffffffffffffb50 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xcba5e5);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb00,(Type)in_stack_fffffffffffffafc,
                 (char *)in_stack_fffffffffffffaf0,(int)in_stack_fffffffffffffaec,
                 (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb50,
                 (Message *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
      testing::Message::~Message((Message *)0xcba648);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcba6b9);
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::resize(in_stack_fffffffffffffad0,(size_type)in_stack_fffffffffffffac8);
    local_190 = google::
                BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcba6da);
    HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                    *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                   (int)((ulong)in_stack_fffffffffffffad0 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    std::__cxx11::string::~string(local_1b0);
    HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_fffffffffffffb18,(int)in_stack_fffffffffffffb14);
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    std::__cxx11::string::~string(local_228);
    local_22c = 2;
    while( true ) {
      HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                      *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                     (int)((ulong)in_stack_fffffffffffffad0 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      std::__cxx11::string::~string(local_250);
      sVar2 = google::
              BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xcba7cc);
      in_stack_fffffffffffffb48 = (float)(long)sVar2;
      in_stack_fffffffffffffb4c = (float)sVar2;
      local_4bc = (float)local_190;
      if (local_14 <= in_stack_fffffffffffffb4c / local_4bc) break;
      local_2c0 = google::
                  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                  ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xcba890);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                 (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                 (unsigned_long *)in_stack_fffffffffffffad0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb00);
        testing::AssertionResult::failure_message((AssertionResult *)0xcba980);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb00,(Type)in_stack_fffffffffffffafc,
                   (char *)in_stack_fffffffffffffaf0,(int)in_stack_fffffffffffffaec,
                   (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb50,
                   (Message *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
        testing::Message::~Message((Message *)0xcba9dd);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcbaa48);
      local_22c = local_22c + 1;
    }
    local_2e8 = google::
                BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcbaa6c);
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (unsigned_long *)in_stack_fffffffffffffad0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2e0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb00);
      testing::AssertionResult::failure_message((AssertionResult *)0xcbaad5);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb00,(Type)in_stack_fffffffffffffafc,
                 (char *)in_stack_fffffffffffffaf0,(int)in_stack_fffffffffffffaec,
                 (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb50,
                 (Message *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
      testing::Message::~Message((Message *)0xcbab32);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcbab9d);
    in_stack_fffffffffffffb18 =
         (HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          *)local_d8;
    sVar2 = google::
            BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
            ::size((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                    *)0xcbabdb);
    local_4dc = (float)sVar2;
    sVar2 = google::
            BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xcbac2a);
    in_stack_fffffffffffffb14 = (float)sVar2;
    local_2fc = local_4dc / in_stack_fffffffffffffb14 + -0.01;
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_resizing_parameters
              (in_stack_fffffffffffffad0,(float)((ulong)in_stack_fffffffffffffac8 >> 0x20),
               SUB84(in_stack_fffffffffffffac8,0));
    local_318 = 0x3ff0000000000000;
    local_31c = google::
                HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                ::max_load_factor((HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffad0);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               (double *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (float *)in_stack_fffffffffffffad0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_310);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb00);
      in_stack_fffffffffffffb00 =
           (HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xcbad3c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb00,(Type)in_stack_fffffffffffffafc,
                 (char *)in_stack_fffffffffffffaf0,(int)in_stack_fffffffffffffaec,
                 (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb50,
                 (Message *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
      testing::Message::~Message((Message *)0xcbad99);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcbae07);
    in_stack_fffffffffffffafc =
         google::
         HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
         ::min_load_factor((HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffad0);
    local_344 = in_stack_fffffffffffffafc;
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               (float *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (float *)in_stack_fffffffffffffad0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_340);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb00);
      in_stack_fffffffffffffaf0 =
           (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0xcbae9e);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb00,(Type)in_stack_fffffffffffffafc,
                 (char *)in_stack_fffffffffffffaf0,(int)in_stack_fffffffffffffaec,
                 (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb50,
                 (Message *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
      testing::Message::~Message((Message *)0xcbaefb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcbaf6c);
    local_190 = google::
                BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcbaf79);
    local_35c = 2;
    while( true ) {
      HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueKey(in_stack_fffffffffffffb18,(int)in_stack_fffffffffffffb14);
      google::
      BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      std::__cxx11::string::~string(local_380);
      HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueKey(in_stack_fffffffffffffb18,(int)in_stack_fffffffffffffb14);
      google::
      BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      std::__cxx11::string::~string(local_3a0);
      HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                      *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                     (int)((ulong)in_stack_fffffffffffffad0 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      std::__cxx11::string::~string(local_3c0);
      sVar2 = google::
              BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xcbb06b);
      in_stack_fffffffffffffae8 = (float)(long)sVar2;
      in_stack_fffffffffffffadc = (float)sVar2;
      in_stack_fffffffffffffae0 = (float)(long)local_190;
      in_stack_fffffffffffffae4 = (float)local_190;
      if (in_stack_fffffffffffffadc / in_stack_fffffffffffffae4 <= local_2fc) break;
      line = in_stack_fffffffffffffadc;
      local_430 = google::
                  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                  ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xcbb11c);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)CONCAT44(line,in_stack_fffffffffffffae8),
                 (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                 (unsigned_long *)in_stack_fffffffffffffad0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_428);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb00);
        in_stack_fffffffffffffad0 =
             (BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0xcbb20c);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb00,(Type)in_stack_fffffffffffffafc,
                   (char *)in_stack_fffffffffffffaf0,(int)line,
                   (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb50,
                   (Message *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
        testing::Message::~Message((Message *)0xcbb269);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcbb2d4);
      local_35c = local_35c + 1;
    }
    in_stack_fffffffffffffaec = in_stack_fffffffffffffadc;
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                    *)0xcbb2f8);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (unsigned_long *)in_stack_fffffffffffffad0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_450);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb00);
      in_stack_fffffffffffffac8 =
           (key_type *)testing::AssertionResult::failure_message((AssertionResult *)0xcbb361);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb00,(Type)in_stack_fffffffffffffafc,
                 (char *)in_stack_fffffffffffffaf0,(int)in_stack_fffffffffffffaec,
                 (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb50,
                 (Message *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
      testing::Message::~Message((Message *)0xcbb3bc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcbb427);
    google::
    HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashtable
              ((HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                *)0xcbb45d);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}